

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

ch_argcount function_arglist(ch_compilation *comp)

{
  _Bool _Var1;
  undefined1 local_40 [8];
  ch_token name;
  ch_argcount argcount;
  ch_compilation *comp_local;
  
  consume(comp,TK_POPEN,"Expected (.",(ch_token *)0x0);
  name._31_1_ = 0;
  do {
    if ((comp->current).kind == TK_PCLOSE) {
LAB_001045b9:
      consume(comp,TK_PCLOSE,"Expected ).",(ch_token *)0x0);
      return name._31_1_;
    }
    name._31_1_ = name._31_1_ + '\x01';
    if (name._31_1_ == -1) {
      error(comp,"Exceeded argument limit.");
      goto LAB_001045b9;
    }
    _Var1 = consume(comp,TK_ID,"Expected variable name.",(ch_token *)local_40);
    if (!_Var1) {
      return '\0';
    }
    add_local(comp,(ch_lexeme)name._0_16_);
    if ((comp->current).kind != TK_PCLOSE) {
      consume(comp,TK_COMMA,"Expected comma.",(ch_token *)0x0);
    }
  } while( true );
}

Assistant:

ch_argcount function_arglist(ch_compilation *comp) {
  consume(comp, TK_POPEN, "Expected (.", NULL);

  ch_argcount argcount = 0;
  while (comp->current.kind != TK_PCLOSE) {
    if (++argcount >= CH_ARGCOUNT_MAX) {
      error(comp, "Exceeded argument limit.");
      break;
    }

    ch_token name;
    if (!consume(comp, TK_ID, "Expected variable name.", &name))
      return 0;

    add_local(comp, name.lexeme);

    if (comp->current.kind != TK_PCLOSE) {
      consume(comp, TK_COMMA, "Expected comma.", NULL);
    }
  }

  consume(comp, TK_PCLOSE, "Expected ).", NULL);

  return argcount;
}